

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cc
# Opt level: O3

void * operator_new(size_t size)

{
  void *pvVar1;
  new_handler p_Var2;
  bad_alloc *this;
  
  while( true ) {
    pvVar1 = malloc(size + (size == 0));
    if (pvVar1 != (void *)0x0) {
      return pvVar1;
    }
    p_Var2 = std::get_new_handler();
    if (p_Var2 == (new_handler)0x0) break;
    (*p_Var2)();
  }
  this = (bad_alloc *)__cxa_allocate_exception(8);
  std::bad_alloc::bad_alloc(this);
  __cxa_throw(this,(type_info *)&std::bad_alloc::typeinfo,std::bad_typeid::~bad_typeid);
}

Assistant:

__attribute__((weak))
void* operator new(size_t size) BADALLOC
{
	if (0 == size)
	{
		size = 1;
	}
	void * mem = malloc(size);
	while (0 == mem)
	{
		new_handler h = std::get_new_handler();
		if (0 != h)
		{
			h();
		}
		else
		{
#if !defined(_CXXRT_NO_EXCEPTIONS)
			throw std::bad_alloc();
#else
			break;
#endif
		}
		mem = malloc(size);
	}

	return mem;
}